

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O1

void __thiscall mraa::Iio::Iio(Iio *this,int device)

{
  mraa_iio_context p_Var1;
  ostream *poVar2;
  invalid_argument *this_00;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  p_Var1 = (mraa_iio_context)mraa_iio_init(device);
  this->m_iio = p_Var1;
  if (p_Var1 != (mraa_iio_context)0x0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"IIO device ",0xb);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,device);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is not valid",0xd);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Iio(int device)
    {
        m_iio = mraa_iio_init(device);
        if (m_iio == NULL) {
            std::ostringstream oss;
            oss << "IIO device " << device << " is not valid";
            throw std::invalid_argument(oss.str());
        }
    }